

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
D5xNvmFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,D5xNvmFlash *this)

{
  _Bit_type *p_Var1;
  byte bVar2;
  uint uVar3;
  uint32_t addr;
  ulong uVar4;
  uint uVar5;
  allocator_type local_2a;
  bool local_29;
  
  local_29 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,&local_29,&local_2a);
  if ((this->super_Flash)._lockRegions != 0) {
    addr = 0x804008;
    uVar5 = 0;
    bVar2 = 0;
    do {
      if ((uVar5 & 7) == 0) {
        bVar2 = Samba::readByte((this->super_Flash)._samba,addr);
        addr = addr + 1;
      }
      p_Var1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar4 = 1L << ((byte)uVar5 & 0x3f);
      uVar3 = uVar5 >> 6;
      if ((bVar2 >> (uVar5 & 7) & 1) == 0) {
        uVar4 = uVar4 | p_Var1[uVar3];
      }
      else {
        uVar4 = ~uVar4 & p_Var1[uVar3];
      }
      p_Var1[uVar3] = uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Flash)._lockRegions);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
D5xNvmFlash::getLockRegions()
{
    uint8_t lockBits = 0;
    uint32_t addr = NVM_UP_ADDR + NVM_UP_NVM_LOCK_OFFSET;
    std::vector<bool> regions(_lockRegions);

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (region % 8 == 0)
            lockBits = _samba.readByte(addr++);
        regions[region] = (lockBits & (1 << (region % 8))) == 0;
    }

    return regions;
}